

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<unsigned_long,_RealCount>::Clear<Memory::HeapAllocator>
          (DListBase<unsigned_long,_RealCount> *this,HeapAllocator *allocator)

{
  DListNodeBase<unsigned_long> *pDVar1;
  bool bVar2;
  DListNodeBase<unsigned_long> **ppDVar3;
  NodeBase *next;
  NodeBase *current;
  HeapAllocator *allocator_local;
  DListBase<unsigned_long,_RealCount> *this_local;
  
  ppDVar3 = DListNodeBase<unsigned_long>::Next(&this->super_DListNodeBase<unsigned_long>);
  next = *ppDVar3;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = DListNodeBase<unsigned_long>::Next(next);
    pDVar1 = *ppDVar3;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<unsigned_long>>
              (allocator,(DListNode<unsigned_long> *)next);
    next = pDVar1;
  }
  ppDVar3 = DListNodeBase<unsigned_long>::Next(&this->super_DListNodeBase<unsigned_long>);
  *ppDVar3 = &this->super_DListNodeBase<unsigned_long>;
  ppDVar3 = DListNodeBase<unsigned_long>::Prev(&this->super_DListNodeBase<unsigned_long>);
  *ppDVar3 = &this->super_DListNodeBase<unsigned_long>;
  RealCount::SetCount(&this->super_RealCount,0);
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }